

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::SoundfieldGroupLabelSubDescriptor::SoundfieldGroupLabelSubDescriptor
          (SoundfieldGroupLabelSubDescriptor *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  SoundfieldGroupLabelSubDescriptor *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  MCALabelSubDescriptor::MCALabelSubDescriptor(&this->super_MCALabelSubDescriptor,d);
  (this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__SoundfieldGroupLabelSubDescriptor_0033b528;
  optional_property<ASDCP::MXF::Array<Kumu::UUID>_>::optional_property
            (&this->GroupOfSoundfieldGroupsLinkID);
  if ((this->super_MCALabelSubDescriptor).super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_MCALabelSubDescriptor).super_InterchangeObject.m_Dict,
                           MDD_SoundfieldGroupLabelSubDescriptor);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_MCALabelSubDescriptor).super_InterchangeObject.super_KLVPacket.m_UL,
                  &local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xfab,
                "ASDCP::MXF::SoundfieldGroupLabelSubDescriptor::SoundfieldGroupLabelSubDescriptor(const Dictionary *)"
               );
}

Assistant:

SoundfieldGroupLabelSubDescriptor::SoundfieldGroupLabelSubDescriptor(const Dictionary* d) : MCALabelSubDescriptor(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_SoundfieldGroupLabelSubDescriptor);
}